

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WhiteRoomOneAction.cpp
# Opt level: O0

ActionResults * __thiscall WhiteRoomOneAction::Go(WhiteRoomOneAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ItemWrapper *this_00;
  ActionResults *pAVar3;
  bool bVar4;
  allocator local_a1;
  string local_a0 [38];
  undefined1 local_7a;
  allocator local_79;
  string local_78 [35];
  undefined1 local_55;
  allocator local_41;
  string local_40 [36];
  itemType local_1c;
  WhiteRoomOneAction *local_18;
  WhiteRoomOneAction *this_local;
  
  local_18 = this;
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  bVar4 = false;
  if (iVar1 == LADDER) {
    local_1c = LADDER;
    this_00 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_1c);
    iVar2 = ItemWrapper::getLocation(this_00);
    bVar4 = iVar2 != HIDDEN;
  }
  if (bVar4) {
    pAVar3 = (ActionResults *)operator_new(0x30);
    local_55 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"You climb down the ladder",&local_41);
    ActionResults::ActionResults(pAVar3,W_ROOM2,(string *)local_40);
    local_55 = 0;
    this_local = (WhiteRoomOneAction *)pAVar3;
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    if (iVar1 == LIGHT) {
      pAVar3 = (ActionResults *)operator_new(0x30);
      local_7a = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_78,"You feel warmer, more content on where your life is going.",&local_79);
      ActionResults::ActionResults(pAVar3,CURRENT,(string *)local_78);
      local_7a = 0;
      this_local = (WhiteRoomOneAction *)pAVar3;
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
    else {
      pAVar3 = (ActionResults *)operator_new(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,"You don\'t go anywhere",&local_a1);
      ActionResults::ActionResults(pAVar3,CURRENT,(string *)local_a0);
      this_local = (WhiteRoomOneAction *)pAVar3;
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    }
  }
  return (ActionResults *)this_local;
}

Assistant:

ActionResults *WhiteRoomOneAction::Go() {
    if(commands->getMainItem() == LADDER && itemList->getValue(LADDER)->getLocation() != HIDDEN) {
        return new ActionResults(W_ROOM2, "You climb down the ladder");
    } else if(commands->getMainItem() == LIGHT){
        return new ActionResults(CURRENT, "You feel warmer, more content on where your life is going.");
    }
    else {
        return new ActionResults(CURRENT, "You don't go anywhere");
    }
}